

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O2

void llvm::hashing::detail::hash_state::mix_32_bytes(char *s,uint64_t *a,uint64_t *b)

{
  uint64_t uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  uVar1 = *a;
  lVar2 = *(long *)s;
  *a = uVar1 + lVar2;
  lVar3 = *(long *)(s + 0x18);
  uVar4 = uVar1 + lVar2 + lVar3 + *b;
  *b = uVar4 << 0x2b | uVar4 >> 0x15;
  uVar1 = *a;
  uVar4 = *(long *)(s + 8) + uVar1 + *(long *)(s + 0x10);
  *a = uVar4;
  *b = uVar1 + *b + (uVar4 * 0x100000 | uVar4 >> 0x2c);
  *a = *a + lVar3;
  return;
}

Assistant:

static void mix_32_bytes(const char *s, uint64_t &a, uint64_t &b) {
    a += fetch64(s);
    uint64_t c = fetch64(s + 24);
    b = rotate(b + a + c, 21);
    uint64_t d = a;
    a += fetch64(s + 8) + fetch64(s + 16);
    b += rotate(a, 44) + d;
    a += c;
  }